

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O1

BigNumber *
partial_multiplication(BigNumber *__return_storage_ptr__,BigNumber *nb1,BigNumber *nb2,uint r)

{
  unsigned_long uVar1;
  const_iterator __position;
  void *pvVar2;
  uint uVar3;
  pointer puVar4;
  uint uVar5;
  pointer puVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  vector<unsigned_int,_std::allocator<unsigned_int>_> resultat_intermedaire;
  BigNumber tmp;
  uint local_10c;
  BigNumber *local_108;
  ulong local_100;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  BigNumber *local_e0;
  uint local_d8;
  value_type local_d4;
  BigNumber local_d0;
  ulong local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  BigNumber local_90;
  BigNumber local_70;
  BigNumber local_50;
  
  uVar1 = nb1->m_base;
  Polynome::Polynome(&__return_storage_ptr__->super_Polynome);
  __return_storage_ptr__->m_base = uVar1;
  puVar4 = (nb1->super_Polynome).m_coef.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(nb1->super_Polynome).m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar4) >> 2) != 0) {
    local_b0 = (ulong)r;
    local_100 = 0;
    local_108 = __return_storage_ptr__;
    local_e0 = nb1;
    do {
      local_10c = 0;
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      puVar6 = (nb2->super_Polynome).m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((nb2->super_Polynome).m_coef.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar6) {
        local_d8 = puVar4[local_100] & 0xffff;
        uVar19 = puVar4[local_100] >> 0x10;
        uVar8 = 0;
        do {
          if (local_100 + uVar8 < local_b0) {
            uVar5 = puVar6[uVar8] >> 0x10;
            uVar7 = puVar6[uVar8] & 0xffff;
            uVar10 = uVar7 * local_d8;
            uVar9 = uVar5 * local_d8;
            uVar7 = uVar7 * uVar19;
            uVar5 = uVar5 * uVar19;
            uVar11 = local_10c & 0xffff;
            uVar15 = 0x10000 - uVar11;
            uVar3 = uVar10 & 0xffff;
            iVar18 = (uint)(uVar15 <= uVar3) + (local_10c >> 0x10);
            uVar10 = uVar10 >> 0x10;
            iVar13 = iVar18 + -0x10000;
            if (uVar10 < 0x10000U - iVar18) {
              iVar13 = iVar18;
            }
            uVar14 = (uint)(0x10000U - iVar18 <= uVar10);
            iVar13 = iVar13 + uVar10;
            uVar12 = uVar9 & 0xffff;
            uVar10 = uVar14 + 1;
            if (uVar12 < 0x10000U - iVar13) {
              uVar10 = uVar14;
            }
            iVar18 = iVar13 + -0x10000;
            if (uVar12 < 0x10000U - iVar13) {
              iVar18 = iVar13;
            }
            uVar17 = (uVar10 + 1) - (uint)((uVar7 & 0xffff) < 0x10000 - (iVar18 + uVar12));
            uVar14 = uVar5 & 0xffff;
            uVar10 = uVar17 | 0xffff0000;
            if (uVar14 < 0x10000 - uVar17) {
              uVar10 = uVar17;
            }
            uVar17 = (uint)(0x10000 - uVar17 <= uVar14);
            iVar16 = uVar10 + uVar14;
            uVar9 = uVar9 >> 0x10;
            iVar13 = iVar16 + -0x10000;
            if (uVar9 < 0x10000U - iVar16) {
              iVar13 = iVar16;
            }
            uVar10 = uVar17 + 1;
            if (uVar9 < 0x10000U - iVar16) {
              uVar10 = uVar17;
            }
            iVar13 = iVar13 + uVar9;
            uVar9 = uVar7 >> 0x10;
            iVar16 = iVar13 + -0x10000;
            if (uVar9 < 0x10000U - iVar13) {
              iVar16 = iVar13;
            }
            iVar13 = (0x10000U - iVar13 <= uVar9) + uVar10;
            uVar5 = uVar5 >> 0x10;
            local_10c = ((iVar16 + uVar9 + 1) - (uint)(uVar5 < 0x10000U - iVar13)) +
                        (iVar13 + uVar5) * 0x10000;
            local_d0.super_Polynome.m_coef.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ =
                 uVar3 + uVar11 + (uint)(uVar3 < uVar15) * 0x10000 + -0x10000 +
                 (iVar18 + uVar12 + uVar7) * 0x10000;
            if (local_e0->m_base >> 0x20 == 0) {
              local_d0.super_Polynome.m_coef.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ =
                   (uint)((ulong)(uint)local_d0.super_Polynome.m_coef.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start %
                         (local_e0->m_base & 0xffffffff));
              local_10c = 0;
            }
            if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_f8,
                         (iterator)
                         local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d0);
            }
            else {
              *local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish =
                   (uint)local_d0.super_Polynome.m_coef.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar8 = uVar8 + 1;
          puVar6 = (nb2->super_Polynome).m_coef.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar8 < (ulong)((long)(nb2->super_Polynome).m_coef.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >>
                                2));
      }
      if (local_10c != 0) {
        if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_f8,
                     (iterator)
                     local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_10c);
        }
        else {
          *local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_10c;
          local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_a8,&local_f8);
      __return_storage_ptr__ = local_108;
      BigNumber::BigNumber(&local_d0,&local_a8,local_e0->m_base);
      if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (0 < (int)local_100) {
        uVar8 = local_100 & 0xffffffff;
        do {
          __position._M_current._4_4_ =
               local_d0.super_Polynome.m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
          __position._M_current._0_4_ =
               (uint)local_d0.super_Polynome.m_coef.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          local_d4 = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_insert_rval
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d0,__position,
                     &local_d4);
          uVar19 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar19;
        } while (uVar19 != 0);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__);
      local_70.m_base = __return_storage_ptr__->m_base;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d0);
      local_90.m_base = local_d0.m_base;
      operator+(&local_50,&local_70,&local_90);
      __return_storage_ptr__->m_base = local_50.m_base;
      puVar4 = (__return_storage_ptr__->super_Polynome).m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((__return_storage_ptr__->super_Polynome).m_coef.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar4) {
        (__return_storage_ptr__->super_Polynome).m_coef.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar4;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
      if (local_50.super_Polynome.m_coef.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.super_Polynome.m_coef.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.super_Polynome.m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.super_Polynome.m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_90.super_Polynome.m_coef.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super_Polynome.m_coef.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.super_Polynome.m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.super_Polynome.m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_70.super_Polynome.m_coef.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.super_Polynome.m_coef.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_70.super_Polynome.m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.super_Polynome.m_coef.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pvVar2 = (void *)CONCAT44(local_d0.super_Polynome.m_coef.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (uint)local_d0.super_Polynome.m_coef.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_d0.super_Polynome.m_coef.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar2);
      }
      if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_f8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_100 = local_100 + 1;
      puVar4 = (local_e0->super_Polynome).m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (local_100 <
             ((ulong)((long)(local_e0->super_Polynome).m_coef.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar4) >> 2 & 0xffffffff));
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber partial_multiplication(BigNumber& nb1, BigNumber& nb2, const unsigned int r){
//    clock_t t1, t2;
//    static clock_t t_tmp;
//    static unsigned int cmp = 0;
//    t1 = clock();
    const unsigned int SIZE_INT16 = 65536;
    BigNumber resultat(nb1.m_base);
    for(unsigned long i = 0; i < nb1.m_degre() ; i++) {
        unsigned int retenue = 0;
        vector<unsigned int> resultat_intermedaire;

        /*
         * On split la valeur du m_coef de 32 bits en deux valeurs de 16 bits
         * On a m_coef = [high1 low1]
         */
        const unsigned int high1 = (nb1.m_coef[i] >> 16);
        const unsigned int low1 = (nb1.m_coef[i] & 0x0000FFFF);

        for (unsigned long j = 0; j < nb2.m_coef.size(); j++) {
            /*
             * Calcul des résultats intermédiaires des sous-blocks de 16bits des opérandes
             */
            if(i + j < r) {

                const unsigned int high2 = (nb2.m_coef[j] >> 16);
                const unsigned int low2 = (nb2.m_coef[j] & 0x0000FFFF);

                /*
                 * On multiplie de nombre de 16 bits; le résultat sera inferieur a 32bits donc pas d'overflow
                 */
                const unsigned int res1 = low1 * low2;
                const unsigned int res2 = high2 * low1;
                const unsigned int res3 = low2 * high1;
                const unsigned int res4 = high1 * high2;


                /*
                 * Calcul du résultat de la multiplication sur 32 bits
                 */


                unsigned int resultat32b = 0;

                /*
                 * Le resultat de la multiplication est donné par [left1, right1]
                 * La retenue est donné par [left2, right2]
                 */
                unsigned int right2 = 0;
                unsigned int left2 = 0;
                unsigned int left1 = 0;
                /*
                 * On initialise a la valeur de la retenue précédente
                 */
                unsigned int right1 = retenue;
                retenue = 0;

                /*
                 * Valeurs sur 16bits ! Si ca dépasse on fait passer l'exédent sur les 16bits suivants
                 * right1 -> left1
                 * left1 -> right2
                 * right2 -> left2
                 * left2 -> retenue
                 */
                left1 = right1 / SIZE_INT16;
                right1 = right1 % SIZE_INT16;

                /*
                 * On additionne avec prudence en vérifiant les overflows possible
                 * pour former le résultat et la retenue sur 32 bits
                 */
                if (SIZE_INT16 - right1 > (res1 & 0x0000FFFF)) {
                    right1 += (res1 & 0x0000FFFF);
                } else {
                    right1 -= SIZE_INT16;
                    right1 += (res1 & 0x0000FFFF);
                    left1 += 1;
                }

                if (SIZE_INT16 - left1 > (res1 >> 16)) {
                    left1 += (res1 >> 16);
                } else {
                    left1 -= SIZE_INT16;
                    left1 += (res1 >> 16);
                    right2 += 1;
                }

                if (SIZE_INT16 - left1 > (res2 & 0x0000FFFF)) {
                    left1 += (res2 & 0x0000FFFF);
                } else {
                    left1 -= SIZE_INT16;
                    left1 += (res2 & 0x0000FFFF);
                    right2 += 1;
                }

                if (SIZE_INT16 - left1 > (res3 & 0x0000FFFF)) {
                    left1 += (res3 & 0x0000FFFF);
                } else {
                    left1 -= SIZE_INT16;
                    left1 += (res3 & 0x0000FFFF);
                    right2 += 1;
                }

                /*
                 * Calcul de la retenue
                 */

                if (SIZE_INT16 - right2 > (res4 & 0x0000FFFF)) {
                    right2 += (res4 & 0x0000FFFF);
                } else {
                    right2 -= SIZE_INT16;
                    right2 += (res4 & 0x0000FFFF);
                    left2 += 1;
                }

                if (SIZE_INT16 - right2 > (res2 >> 16)) {
                    right2 += (res2 >> 16);
                } else {
                    right2 -= SIZE_INT16;
                    right2 += (res2 >> 16);
                    left2 += 1;
                }

                if (SIZE_INT16 - right2 > (res3 >> 16)) {
                    right2 += (res3 >> 16);
                } else {
                    right2 -= SIZE_INT16;
                    right2 += (res3 >> 16);
                    left2 += 1;
                }

                if (SIZE_INT16 - left2 > (res4 >> 16)) {
                    left2 += (res4 >> 16);
                } else {
                    left2 -= SIZE_INT16;
                    left2 += (res4 >> 16);
                    retenue += 1;
                }

                retenue += (left2 << 16) + right2;
                resultat32b += (left1 << 16) + right1;
                if (nb1.m_base < 4294967296) {
                    resultat32b = resultat32b % (unsigned int) nb1.m_base;
                    retenue = resultat32b / (unsigned int) nb1.m_base;
                }
                resultat_intermedaire.emplace_back(resultat32b);
            }
        }

        if(retenue != 0){
            resultat_intermedaire.emplace_back(retenue);
        }
        BigNumber tmp(resultat_intermedaire, nb1.m_base);
        tmp >> i;
        resultat = resultat + tmp;
    }
//    t2 = clock();
//    t_tmp += (t2 - t1);
//    cmp += 1;
//    cout << "Multiplication : " << t_tmp / (float)cmp << endl;

    return resultat;
}